

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void base_delete(tsdn_t *tsdn,base_t *base)

{
  extent_hooks_t *size;
  base_t *in_RSI;
  base_block_t *block;
  base_block_t *next;
  extent_hooks_t *extent_hooks;
  base_block_t *addr;
  base_block_t *pbVar1;
  extent_hooks_t *extent_hooks_00;
  
  size = base_extent_hooks_get(in_RSI);
  addr = in_RSI->blocks;
  do {
    pbVar1 = addr->next;
    extent_hooks_00 = size;
    base_ind_get(in_RSI);
    base_unmap((tsdn_t *)in_RSI,extent_hooks_00,(uint)((ulong)pbVar1 >> 0x20),addr,(size_t)size);
    addr = pbVar1;
    size = extent_hooks_00;
  } while (pbVar1 != (base_block_t *)0x0);
  return;
}

Assistant:

void
base_delete(tsdn_t *tsdn, base_t *base) {
	extent_hooks_t *extent_hooks = base_extent_hooks_get(base);
	base_block_t *next = base->blocks;
	do {
		base_block_t *block = next;
		next = block->next;
		base_unmap(tsdn, extent_hooks, base_ind_get(base), block,
		    block->size);
	} while (next != NULL);
}